

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * match(MatchState *ms,char *s,char *p)

{
  int iVar1;
  MatchState *pMVar2;
  char *pcVar3;
  MatchState *ms_00;
  char *in_RDX;
  MatchState *in_RSI;
  long *in_RDI;
  char *res;
  int m;
  char *ep_1;
  char previous;
  char *ep;
  undefined8 in_stack_ffffffffffffff98;
  ErrMsg em;
  lua_State *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint uVar4;
  char cVar5;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  MatchState *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffe0;
  
  iVar1 = *(int *)((long)in_RDI + 0x1c) + 1;
  *(int *)((long)in_RDI + 0x1c) = iVar1;
  em = (ErrMsg)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (200 < iVar1) {
    lj_err_caller(in_stack_ffffffffffffffa0,em);
  }
LAB_0018a02d:
  ms_00 = (MatchState *)(ulong)(uint)(int)*in_RDX;
  pMVar2 = in_RSI;
  switch(ms_00) {
  case (MatchState *)0x0:
    goto LAB_0018a416;
  default:
    break;
  case (MatchState *)0x24:
    if (in_RDX[1] == '\0') {
      if (in_RSI != (MatchState *)in_RDI[1]) {
        pMVar2 = (MatchState *)0x0;
      }
      goto LAB_0018a416;
    }
    break;
  case (MatchState *)0x25:
    in_stack_ffffffffffffffb4 = (int)in_RDX[1];
    if (in_stack_ffffffffffffffb4 == 0x62) {
      in_RSI = (MatchState *)
               matchbalance(ms_00,(char *)CONCAT44(0x62,in_stack_ffffffffffffffb0),
                            (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      pMVar2 = in_RSI;
      if (in_RSI == (MatchState *)0x0) goto LAB_0018a416;
      in_RDX = in_RDX + 4;
    }
    else {
      if (in_stack_ffffffffffffffb4 == 0x66) goto LAB_0018a134;
      if ((""[(ulong)(byte)in_RDX[1] + 1] & 8) == 0) break;
      in_RSI = (MatchState *)
               match_capture((MatchState *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (char *)in_stack_ffffffffffffffa0,em);
      pMVar2 = in_RSI;
      if (in_RSI == (MatchState *)0x0) goto LAB_0018a416;
      in_RDX = in_RDX + 2;
    }
    goto LAB_0018a02d;
  case (MatchState *)0x28:
    if (in_RDX[1] == ')') {
      pMVar2 = (MatchState *)
               start_capture(in_stack_ffffffffffffffc0,(char *)ms_00,
                             (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac);
    }
    else {
      pMVar2 = (MatchState *)
               start_capture(in_stack_ffffffffffffffc0,(char *)ms_00,
                             (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac);
    }
    goto LAB_0018a416;
  case (MatchState *)0x29:
    pMVar2 = (MatchState *)
             end_capture((MatchState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                         ,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (char *)in_stack_ffffffffffffffa0);
    goto LAB_0018a416;
  }
  pcVar3 = classend((MatchState *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (char *)in_stack_ffffffffffffffa0);
  uVar4 = in_stack_ffffffffffffffac & 0xffffff;
  if (in_RSI < (MatchState *)in_RDI[1]) {
    iVar1 = singlematch(in_stack_ffffffffffffffb0,
                        (char *)(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8) &
                                0xffffffffffffff),(char *)in_stack_ffffffffffffffa0);
    uVar4 = CONCAT13(iVar1 != 0,(int3)uVar4);
  }
  in_stack_ffffffffffffffac = uVar4;
  cVar5 = (char)(in_stack_ffffffffffffffac >> 0x18);
  in_stack_ffffffffffffffa0 = (lua_State *)(ulong)((int)*pcVar3 - 0x2a);
  switch(in_stack_ffffffffffffffa0) {
  case (lua_State *)0x0:
    pMVar2 = (MatchState *)
             max_expand((MatchState *)(ulong)CONCAT14(cVar5,in_stack_ffffffffffffffc8),
                        (char *)in_stack_ffffffffffffffc0,(char *)ms_00,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    goto LAB_0018a416;
  case (lua_State *)0x1:
    if (cVar5 == '\0') {
      pMVar2 = (MatchState *)0x0;
    }
    else {
      pMVar2 = (MatchState *)
               max_expand((MatchState *)(ulong)CONCAT14(cVar5,in_stack_ffffffffffffffc8),
                          (char *)in_stack_ffffffffffffffc0,(char *)ms_00,
                          (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    goto LAB_0018a416;
  default:
    if (cVar5 == '\0') {
      pMVar2 = (MatchState *)0x0;
      goto LAB_0018a416;
    }
    in_RSI = (MatchState *)((long)&in_RSI->src_init + 1);
    in_RDX = pcVar3;
    break;
  case (lua_State *)0x3:
    pMVar2 = (MatchState *)
             min_expand(ms_00,(char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (char *)in_stack_ffffffffffffffa0);
    goto LAB_0018a416;
  case (lua_State *)0x15:
    if ((cVar5 != '\0') &&
       (in_stack_ffffffffffffffc0 = (MatchState *)match(in_RSI,in_RDX,in_stack_ffffffffffffffe0),
       pMVar2 = in_stack_ffffffffffffffc0, in_stack_ffffffffffffffc0 != (MatchState *)0x0))
    goto LAB_0018a416;
    in_RDX = pcVar3 + 1;
  }
  goto LAB_0018a02d;
LAB_0018a134:
  if (in_RDX[2] != '[') {
    lj_err_caller(in_stack_ffffffffffffffa0,em);
  }
  in_stack_ffffffffffffffe0 =
       classend((MatchState *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                (char *)in_stack_ffffffffffffffa0);
  if (in_RSI == (MatchState *)*in_RDI) {
    in_stack_ffffffffffffffb0 = 0;
  }
  else {
    in_stack_ffffffffffffffb0 = (int)*(char *)((long)&in_RSI[-1].capture[0x1f].len + 7);
  }
  iVar1 = matchbracketclass(in_stack_ffffffffffffffb0,
                            (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            (char *)in_stack_ffffffffffffffa0);
  if ((iVar1 != 0) ||
     (iVar1 = matchbracketclass(in_stack_ffffffffffffffb0,
                                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ),(char *)in_stack_ffffffffffffffa0),
     in_RDX = in_stack_ffffffffffffffe0, iVar1 == 0)) {
    pMVar2 = (MatchState *)0x0;
LAB_0018a416:
    *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + -1;
    return (char *)pMVar2;
  }
  goto LAB_0018a02d;
}

Assistant:

static const char *match(MatchState *ms, const char *s, const char *p)
{
  if (++ms->depth > LJ_MAX_XLEVEL)
    lj_err_caller(ms->L, LJ_ERR_STRPATX);
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
  case '(':  /* start capture */
    if (*(p+1) == ')')  /* position capture? */
      s = start_capture(ms, s, p+2, CAP_POSITION);
    else
      s = start_capture(ms, s, p+1, CAP_UNFINISHED);
    break;
  case ')':  /* end capture */
    s = end_capture(ms, s, p+1);
    break;
  case L_ESC:
    switch (*(p+1)) {
    case 'b':  /* balanced string? */
      s = matchbalance(ms, s, p+2);
      if (s == NULL) break;
      p+=4;
      goto init;  /* else s = match(ms, s, p+4); */
    case 'f': {  /* frontier? */
      const char *ep; char previous;
      p += 2;
      if (*p != '[')
	lj_err_caller(ms->L, LJ_ERR_STRPATB);
      ep = classend(ms, p);  /* points to what is next */
      previous = (s == ms->src_init) ? '\0' : *(s-1);
      if (matchbracketclass(uchar(previous), p, ep-1) ||
	 !matchbracketclass(uchar(*s), p, ep-1)) { s = NULL; break; }
      p=ep;
      goto init;  /* else s = match(ms, s, ep); */
      }
    default:
      if (lj_char_isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
	s = match_capture(ms, s, uchar(*(p+1)));
	if (s == NULL) break;
	p+=2;
	goto init;  /* else s = match(ms, s, p+2) */
      }
      goto dflt;  /* case default */
    }
    break;
  case '\0':  /* end of pattern */
    break;  /* match succeeded */
  case '$':
    /* is the `$' the last char in pattern? */
    if (*(p+1) != '\0') goto dflt;
    if (s != ms->src_end) s = NULL;  /* check end of string */
    break;
  default: dflt: {  /* it is a pattern item */
    const char *ep = classend(ms, p);  /* points to what is next */
    int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
    switch (*ep) {
    case '?': {  /* optional */
      const char *res;
      if (m && ((res=match(ms, s+1, ep+1)) != NULL)) {
	s = res;
	break;
      }
      p=ep+1;
      goto init;  /* else s = match(ms, s, ep+1); */
      }
    case '*':  /* 0 or more repetitions */
      s = max_expand(ms, s, p, ep);
      break;
    case '+':  /* 1 or more repetitions */
      s = (m ? max_expand(ms, s+1, p, ep) : NULL);
      break;
    case '-':  /* 0 or more repetitions (minimum) */
      s = min_expand(ms, s, p, ep);
      break;
    default:
      if (m) { s++; p=ep; goto init; }  /* else s = match(ms, s+1, ep); */
      s = NULL;
      break;
    }
    break;
    }
  }
  ms->depth--;
  return s;
}